

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwWindowHint(int target,int hint)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int hint_local;
  int target_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    iVar1 = _glfw.hints.framebuffer.redBits;
    iVar2 = _glfw.hints.framebuffer.greenBits;
    iVar3 = _glfw.hints.framebuffer.blueBits;
    iVar4 = _glfw.hints.framebuffer.alphaBits;
    iVar5 = _glfw.hints.framebuffer.depthBits;
    iVar6 = _glfw.hints.framebuffer.stencilBits;
    iVar7 = _glfw.hints.framebuffer.accumRedBits;
    iVar8 = _glfw.hints.framebuffer.accumGreenBits;
    iVar9 = _glfw.hints.framebuffer.accumBlueBits;
    iVar10 = _glfw.hints.framebuffer.accumAlphaBits;
    iVar11 = _glfw.hints.framebuffer.auxBuffers;
    iVar12 = _glfw.hints.framebuffer.samples;
    iVar13 = _glfw.hints.context.api;
    iVar14 = _glfw.hints.context.major;
    iVar15 = _glfw.hints.context.minor;
    iVar16 = _glfw.hints.context.profile;
    iVar17 = _glfw.hints.context.robustness;
    iVar18 = _glfw.hints.context.release;
    iVar19 = _glfw.hints.refreshRate;
  }
  else {
    iVar1 = _glfw.hints.framebuffer.redBits;
    iVar2 = _glfw.hints.framebuffer.greenBits;
    iVar3 = _glfw.hints.framebuffer.blueBits;
    iVar4 = _glfw.hints.framebuffer.alphaBits;
    iVar5 = _glfw.hints.framebuffer.depthBits;
    iVar6 = _glfw.hints.framebuffer.stencilBits;
    iVar7 = _glfw.hints.framebuffer.accumRedBits;
    iVar8 = _glfw.hints.framebuffer.accumGreenBits;
    iVar9 = _glfw.hints.framebuffer.accumBlueBits;
    iVar10 = _glfw.hints.framebuffer.accumAlphaBits;
    iVar11 = _glfw.hints.framebuffer.auxBuffers;
    iVar12 = _glfw.hints.framebuffer.samples;
    iVar13 = _glfw.hints.context.api;
    iVar14 = _glfw.hints.context.major;
    iVar15 = _glfw.hints.context.minor;
    iVar16 = _glfw.hints.context.profile;
    iVar17 = _glfw.hints.context.robustness;
    iVar18 = _glfw.hints.context.release;
    iVar19 = _glfw.hints.refreshRate;
    if (target == 0x20001) {
      _glfw.hints.window.focused = hint != 0;
    }
    else if (target == 0x20003) {
      _glfw.hints.window.resizable = hint != 0;
    }
    else if (target == 0x20004) {
      _glfw.hints.window.visible = hint != 0;
    }
    else if (target == 0x20005) {
      _glfw.hints.window.decorated = hint != 0;
    }
    else if (target == 0x20006) {
      _glfw.hints.window.autoIconify = hint != 0;
    }
    else if (target == 0x20007) {
      _glfw.hints.window.floating = hint != 0;
    }
    else {
      iVar1 = hint;
      if ((((((target != 0x21001) &&
             (iVar1 = _glfw.hints.framebuffer.redBits, iVar2 = hint, target != 0x21002)) &&
            (iVar2 = _glfw.hints.framebuffer.greenBits, iVar3 = hint, target != 0x21003)) &&
           (((iVar3 = _glfw.hints.framebuffer.blueBits, iVar4 = hint, target != 0x21004 &&
             (iVar4 = _glfw.hints.framebuffer.alphaBits, iVar5 = hint, target != 0x21005)) &&
            ((iVar5 = _glfw.hints.framebuffer.depthBits, iVar6 = hint, target != 0x21006 &&
             ((iVar6 = _glfw.hints.framebuffer.stencilBits, iVar7 = hint, target != 0x21007 &&
              (iVar7 = _glfw.hints.framebuffer.accumRedBits, iVar8 = hint, target != 0x21008))))))))
          && (iVar8 = _glfw.hints.framebuffer.accumGreenBits, iVar9 = hint, target != 0x21009)) &&
         ((iVar9 = _glfw.hints.framebuffer.accumBlueBits, iVar10 = hint, target != 0x2100a &&
          (iVar10 = _glfw.hints.framebuffer.accumAlphaBits, iVar11 = hint, target != 0x2100b)))) {
        if (target == 0x2100c) {
          _glfw.hints.framebuffer.stereo = (int)(hint != 0);
          iVar11 = _glfw.hints.framebuffer.auxBuffers;
        }
        else {
          iVar11 = _glfw.hints.framebuffer.auxBuffers;
          iVar12 = hint;
          if (target != 0x2100d) {
            if (target == 0x2100e) {
              _glfw.hints.framebuffer.sRGB = (int)(hint != 0);
              iVar12 = _glfw.hints.framebuffer.samples;
            }
            else {
              iVar12 = _glfw.hints.framebuffer.samples;
              iVar19 = hint;
              if (target != 0x2100f) {
                if (target == 0x21010) {
                  _glfw.hints.framebuffer.doublebuffer = (int)(hint != 0);
                  iVar19 = _glfw.hints.refreshRate;
                }
                else {
                  iVar13 = hint;
                  iVar19 = _glfw.hints.refreshRate;
                  if ((((target != 0x22001) &&
                       (iVar13 = _glfw.hints.context.api, iVar14 = hint, target != 0x22002)) &&
                      (iVar14 = _glfw.hints.context.major, iVar15 = hint, target != 0x22003)) &&
                     (iVar15 = _glfw.hints.context.minor, iVar17 = hint, target != 0x22005)) {
                    if (target == 0x22006) {
                      _glfw.hints.context.forward = hint != 0;
                      iVar17 = _glfw.hints.context.robustness;
                    }
                    else if (target == 0x22007) {
                      _glfw.hints.context.debug = hint != 0;
                      iVar17 = _glfw.hints.context.robustness;
                    }
                    else {
                      iVar16 = hint;
                      iVar17 = _glfw.hints.context.robustness;
                      if ((target != 0x22008) &&
                         (iVar16 = _glfw.hints.context.profile, iVar18 = hint, target != 0x22009)) {
                        _glfwInputError(0x10003,"Invalid window hint");
                        iVar1 = _glfw.hints.framebuffer.redBits;
                        iVar2 = _glfw.hints.framebuffer.greenBits;
                        iVar3 = _glfw.hints.framebuffer.blueBits;
                        iVar4 = _glfw.hints.framebuffer.alphaBits;
                        iVar5 = _glfw.hints.framebuffer.depthBits;
                        iVar6 = _glfw.hints.framebuffer.stencilBits;
                        iVar7 = _glfw.hints.framebuffer.accumRedBits;
                        iVar8 = _glfw.hints.framebuffer.accumGreenBits;
                        iVar9 = _glfw.hints.framebuffer.accumBlueBits;
                        iVar10 = _glfw.hints.framebuffer.accumAlphaBits;
                        iVar11 = _glfw.hints.framebuffer.auxBuffers;
                        iVar12 = _glfw.hints.framebuffer.samples;
                        iVar13 = _glfw.hints.context.api;
                        iVar14 = _glfw.hints.context.major;
                        iVar15 = _glfw.hints.context.minor;
                        iVar16 = _glfw.hints.context.profile;
                        iVar17 = _glfw.hints.context.robustness;
                        iVar18 = _glfw.hints.context.release;
                        iVar19 = _glfw.hints.refreshRate;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  _glfw.hints.refreshRate = iVar19;
  _glfw.hints.context.release = iVar18;
  _glfw.hints.context.robustness = iVar17;
  _glfw.hints.context.profile = iVar16;
  _glfw.hints.context.minor = iVar15;
  _glfw.hints.context.major = iVar14;
  _glfw.hints.context.api = iVar13;
  _glfw.hints.framebuffer.samples = iVar12;
  _glfw.hints.framebuffer.auxBuffers = iVar11;
  _glfw.hints.framebuffer.accumAlphaBits = iVar10;
  _glfw.hints.framebuffer.accumBlueBits = iVar9;
  _glfw.hints.framebuffer.accumGreenBits = iVar8;
  _glfw.hints.framebuffer.accumRedBits = iVar7;
  _glfw.hints.framebuffer.stencilBits = iVar6;
  _glfw.hints.framebuffer.depthBits = iVar5;
  _glfw.hints.framebuffer.alphaBits = iVar4;
  _glfw.hints.framebuffer.blueBits = iVar3;
  _glfw.hints.framebuffer.greenBits = iVar2;
  _glfw.hints.framebuffer.redBits = iVar1;
  return;
}

Assistant:

GLFWAPI void glfwWindowHint(int target, int hint)
{
    _GLFW_REQUIRE_INIT();

    switch (target)
    {
        case GLFW_RED_BITS:
            _glfw.hints.framebuffer.redBits = hint;
            break;
        case GLFW_GREEN_BITS:
            _glfw.hints.framebuffer.greenBits = hint;
            break;
        case GLFW_BLUE_BITS:
            _glfw.hints.framebuffer.blueBits = hint;
            break;
        case GLFW_ALPHA_BITS:
            _glfw.hints.framebuffer.alphaBits = hint;
            break;
        case GLFW_DEPTH_BITS:
            _glfw.hints.framebuffer.depthBits = hint;
            break;
        case GLFW_STENCIL_BITS:
            _glfw.hints.framebuffer.stencilBits = hint;
            break;
        case GLFW_ACCUM_RED_BITS:
            _glfw.hints.framebuffer.accumRedBits = hint;
            break;
        case GLFW_ACCUM_GREEN_BITS:
            _glfw.hints.framebuffer.accumGreenBits = hint;
            break;
        case GLFW_ACCUM_BLUE_BITS:
            _glfw.hints.framebuffer.accumBlueBits = hint;
            break;
        case GLFW_ACCUM_ALPHA_BITS:
            _glfw.hints.framebuffer.accumAlphaBits = hint;
            break;
        case GLFW_AUX_BUFFERS:
            _glfw.hints.framebuffer.auxBuffers = hint;
            break;
        case GLFW_STEREO:
            _glfw.hints.framebuffer.stereo = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_DOUBLEBUFFER:
            _glfw.hints.framebuffer.doublebuffer = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_SAMPLES:
            _glfw.hints.framebuffer.samples = hint;
            break;
        case GLFW_SRGB_CAPABLE:
            _glfw.hints.framebuffer.sRGB = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_RESIZABLE:
            _glfw.hints.window.resizable = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_DECORATED:
            _glfw.hints.window.decorated = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_FOCUSED:
            _glfw.hints.window.focused = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_AUTO_ICONIFY:
            _glfw.hints.window.autoIconify = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_FLOATING:
            _glfw.hints.window.floating = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_VISIBLE:
            _glfw.hints.window.visible = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_CLIENT_API:
            _glfw.hints.context.api = hint;
            break;
        case GLFW_CONTEXT_VERSION_MAJOR:
            _glfw.hints.context.major = hint;
            break;
        case GLFW_CONTEXT_VERSION_MINOR:
            _glfw.hints.context.minor = hint;
            break;
        case GLFW_CONTEXT_ROBUSTNESS:
            _glfw.hints.context.robustness = hint;
            break;
        case GLFW_OPENGL_FORWARD_COMPAT:
            _glfw.hints.context.forward = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            _glfw.hints.context.debug = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_OPENGL_PROFILE:
            _glfw.hints.context.profile = hint;
            break;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            _glfw.hints.context.release = hint;
            break;
        case GLFW_REFRESH_RATE:
            _glfw.hints.refreshRate = hint;
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid window hint");
            break;
    }
}